

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

string * __thiscall
t_dart_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_type *ttype)

{
  int iVar1;
  t_base_type *type;
  t_dart_generator *this_00;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  this_00 = this;
  type = (t_base_type *)t_type::get_true_type(ttype);
  iVar1 = (*(type->super_t_type).super_t_doc._vptr_t_doc[5])(type);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(type->super_t_type).super_t_doc._vptr_t_doc[10])(type);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(type->super_t_type).super_t_doc._vptr_t_doc[0x10])(type);
      if ((char)iVar1 == '\0') {
        iVar1 = (*(type->super_t_type).super_t_doc._vptr_t_doc[0xf])(type);
        if ((char)iVar1 == '\0') {
          iVar1 = (*(type->super_t_type).super_t_doc._vptr_t_doc[0xe])(type);
          if ((char)iVar1 == '\0') {
            get_ttype_class_name_abi_cxx11_(__return_storage_ptr__,this,(t_type *)type);
            return __return_storage_ptr__;
          }
          type_name_abi_cxx11_
                    (&local_a0,this,(t_type *)type[1].super_t_type.super_t_doc.doc_._M_dataplus._M_p
                    );
          std::operator+(&local_c0,"List<",&local_a0);
          std::operator+(__return_storage_ptr__,&local_c0,">");
        }
        else {
          type_name_abi_cxx11_
                    (&local_a0,this,(t_type *)type[1].super_t_type.super_t_doc.doc_._M_dataplus._M_p
                    );
          std::operator+(&local_c0,"Set<",&local_a0);
          std::operator+(__return_storage_ptr__,&local_c0,">");
        }
        std::__cxx11::string::~string((string *)&local_c0);
        this_01 = &local_a0;
      }
      else {
        type_name_abi_cxx11_
                  (&local_40,this,(t_type *)type[1].super_t_type.super_t_doc.doc_._M_dataplus._M_p);
        std::operator+(&local_60,"Map<",&local_40);
        std::operator+(&local_a0,&local_60,", ");
        type_name_abi_cxx11_
                  (&local_80,this,(t_type *)type[1].super_t_type.super_t_doc.doc_._M_string_length);
        std::operator+(&local_c0,&local_a0,&local_80);
        std::operator+(__return_storage_ptr__,&local_c0,">");
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_60);
        this_01 = &local_40;
      }
      std::__cxx11::string::~string((string *)this_01);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"int",(allocator *)&local_c0);
    }
  }
  else {
    base_type_name_abi_cxx11_(__return_storage_ptr__,this_00,type);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::type_name(t_type* ttype) {
  ttype = get_true_type(ttype);

  if (ttype->is_base_type()) {
    return base_type_name((t_base_type*)ttype);
  } else if (ttype->is_enum()) {
    return "int";
  } else if (ttype->is_map()) {
    t_map* tmap = (t_map*)ttype;
    return "Map<" + type_name(tmap->get_key_type()) + ", "
                  + type_name(tmap->get_val_type()) + ">";
  } else if (ttype->is_set()) {
    t_set* tset = (t_set*)ttype;
    return "Set<" + type_name(tset->get_elem_type()) + ">";
  } else if (ttype->is_list()) {
    t_list* tlist = (t_list*)ttype;
    return "List<" + type_name(tlist->get_elem_type()) + ">";
  }

  return get_ttype_class_name(ttype);
}